

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

UINT8 __thiscall DROPlayer::SeekToFilePos(DROPlayer *this,UINT32 pos)

{
  uint uVar1;
  UINT32 UVar2;
  
  this->_playState = this->_playState | 8;
  uVar1 = this->_filePos;
  if ((this->_fileHdr).verMajor < 2) {
    while ((uVar1 <= pos && ((this->_playState & 2) == 0))) {
      DoCommand_v1(this);
      uVar1 = this->_filePos;
    }
  }
  else {
    while ((uVar1 <= pos && ((this->_playState & 2) == 0))) {
      DoCommand_v2(this);
      uVar1 = this->_filePos;
    }
  }
  this->_playTick = this->_fileTick;
  UVar2 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this);
  this->_playSmpl = UVar2;
  this->_playState = this->_playState & 0xf7;
  return '\0';
}

Assistant:

UINT8 DROPlayer::SeekToFilePos(UINT32 pos)
{
	_playState |= PLAYSTATE_SEEK;
	if (_fileHdr.verMajor < 2)
	{
		while(_filePos <= pos && ! (_playState & PLAYSTATE_END))
			DoCommand_v1();
	}
	else
	{
		while(_filePos <= pos && ! (_playState & PLAYSTATE_END))
			DoCommand_v2();
	}
	_playTick = _fileTick;
	_playSmpl = Tick2Sample(_playTick);
	_playState &= ~PLAYSTATE_SEEK;
	
	return 0x00;
}